

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O2

bool __thiscall QSqlTableModel::updateRowInTable(QSqlTableModel *this,int row,QSqlRecord *values)

{
  QSqlDatabase *this_00;
  long lVar1;
  QSqlTableModelPrivate *this_01;
  QExplicitlySharedDataPointer<QSqlErrorPrivate> QVar2;
  bool bVar3;
  int iVar4;
  QSqlDriver *pQVar5;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_e8;
  QArrayDataPointer<char16_t> local_c8;
  QSqlError local_a8;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  QSqlRecord whereValues;
  QSqlRecord rec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QSqlTableModelPrivate **)&(this->super_QSqlQueryModel).field_0x8;
  rec.d.d.ptr = (QExplicitlySharedDataPointer<QSqlRecordPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QSqlRecord::QSqlRecord(&rec,values);
  beforeUpdate(this,row,&rec);
  whereValues.d.d.ptr = (QExplicitlySharedDataPointer<QSqlRecordPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  primaryValues((QSqlTableModel *)&whereValues,(int)this);
  this_00 = &this_01->db;
  pQVar5 = QSqlDatabase::driver(this_00);
  bVar3 = (bool)(**(code **)(*(long *)pQVar5 + 0xb8))(pQVar5,4);
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar5 = QSqlDatabase::driver(this_00);
  (**(code **)(*(long *)pQVar5 + 0xa8))(&local_68,pQVar5,2,&this_01->tableName,&rec,bVar3);
  local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar5 = QSqlDatabase::driver(this_00);
  (**(code **)(*(long *)pQVar5 + 0xa8))(&local_88,pQVar5,0,&this_01->tableName,&whereValues,bVar3);
  if ((((undefined1 *)local_68.size != (undefined1 *)0x0) && (-1 < row)) &&
     ((undefined1 *)local_88.size != (undefined1 *)0x0)) {
    local_a0.d = (Data *)0xffffffffffffffff;
    local_a0.ptr = (char16_t *)0x0;
    local_a0.size = 0;
    iVar4 = (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x78))(this);
    if (row < iVar4) {
      QSqlQueryModelSql::concat((QString *)&local_a0,(QString *)&local_68,(QString *)&local_88);
      bVar3 = QSqlTableModelPrivate::exec(this_01,(QString *)&local_a0,bVar3,&rec,&whereValues);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
      goto LAB_001350d2;
    }
  }
  latin1.m_data = "No Fields to update";
  latin1.m_size = 0x13;
  QString::QString((QString *)&local_a0,latin1);
  local_c8.d = (Data *)0x0;
  local_c8.ptr = (char16_t *)0x0;
  local_c8.size = 0;
  local_e8.d = (Data *)0x0;
  local_e8.ptr = (char16_t *)0x0;
  local_e8.size = 0;
  QSqlError::QSqlError
            (&local_a8,(QString *)&local_a0,(QString *)&local_c8,StatementError,(QString *)&local_e8
            );
  QVar2.d.ptr = (totally_ordered_wrapper<QSqlErrorPrivate_*>)
                (this_01->super_QSqlQueryModelPrivate).error.d.d.ptr;
  (this_01->super_QSqlQueryModelPrivate).error.d.d.ptr = (QSqlErrorPrivate *)local_a8.d.d.ptr;
  local_a8.d.d.ptr =
       (QExplicitlySharedDataPointer<QSqlErrorPrivate>)
       (QExplicitlySharedDataPointer<QSqlErrorPrivate>)QVar2.d.ptr;
  QSqlError::~QSqlError(&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  bVar3 = false;
LAB_001350d2:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QSqlRecord::~QSqlRecord(&whereValues);
  QSqlRecord::~QSqlRecord(&rec);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlTableModel::updateRowInTable(int row, const QSqlRecord &values)
{
    Q_D(QSqlTableModel);
    QSqlRecord rec(values);
    emit beforeUpdate(row, rec);

    const QSqlRecord whereValues = primaryValues(row);
    const bool prepStatement = d->db.driver()->hasFeature(QSqlDriver::PreparedQueries);
    const QString stmt = d->db.driver()->sqlStatement(QSqlDriver::UpdateStatement, d->tableName,
                                                     rec, prepStatement);
    const QString where = d->db.driver()->sqlStatement(QSqlDriver::WhereStatement, d->tableName,
                                                       whereValues, prepStatement);

    if (stmt.isEmpty() || where.isEmpty() || row < 0 || row >= rowCount()) {
        d->error = QSqlError("No Fields to update"_L1, QString(), QSqlError::StatementError);
        return false;
    }

    return d->exec(SqlTm::concat(stmt, where), prepStatement, rec, whereValues);
}